

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::AppendToList
          (ExtensionSet *this,Descriptor *containing_type,DescriptorPool *pool,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  pointer *pppFVar1;
  int iVar2;
  _Base_ptr in_RAX;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  iterator __position;
  _Base_ptr local_38;
  
  p_Var4 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = in_RAX;
  do {
    if ((_Rb_tree_header *)p_Var4 == &(this->extensions_)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    if (*(char *)((long)&p_Var4[1]._M_left + 1) == '\x01') {
      iVar2 = Extension::GetSize((Extension *)&p_Var4[1]._M_parent);
      if (0 < iVar2) {
LAB_005a4a9e:
        p_Var3 = p_Var4[1]._M_right;
        if (p_Var3 == (_Base_ptr)0x0) {
          p_Var3 = (_Base_ptr)
                   DescriptorPool::FindExtensionByNumber(pool,containing_type,p_Var4[1]._M_color);
          __position._M_current =
               (output->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_38 = p_Var3;
          if (__position._M_current !=
              (output->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_005a4adc;
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)output,__position,(FieldDescriptor **)&local_38);
        }
        else {
          __position._M_current =
               (output->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (output->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                      ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        *)output,__position,(FieldDescriptor **)&p_Var4[1]._M_right);
          }
          else {
LAB_005a4adc:
            *__position._M_current = (FieldDescriptor *)p_Var3;
            pppFVar1 = &(output->
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppFVar1 = *pppFVar1 + 1;
          }
        }
      }
    }
    else if (((ulong)p_Var4[1]._M_left & 0x10000) == 0) goto LAB_005a4a9e;
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

void ExtensionSet::AppendToList(
    const Descriptor* containing_type,
    const DescriptorPool* pool,
    std::vector<const FieldDescriptor*>* output) const {
  for (ExtensionMap::const_iterator iter = extensions_.begin();
       iter != extensions_.end(); ++iter) {
    bool has = false;
    if (iter->second.is_repeated) {
      has = iter->second.GetSize() > 0;
    } else {
      has = !iter->second.is_cleared;
    }

    if (has) {
      // TODO(kenton): Looking up each field by number is somewhat unfortunate.
      //   Is there a better way?  The problem is that descriptors are lazily-
      //   initialized, so they might not even be constructed until
      //   AppendToList() is called.

      if (iter->second.descriptor == NULL) {
        output->push_back(pool->FindExtensionByNumber(
            containing_type, iter->first));
      } else {
        output->push_back(iter->second.descriptor);
      }
    }
  }
}